

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

bool __thiscall
CKey::Sign(CKey *this,uint256 *hash,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,
          bool grind,uint32_t test_case)

{
  array<unsigned_char,_32UL> *paVar1;
  int iVar2;
  int iVar3;
  ulong *noncedata;
  long in_FS_OFFSET;
  size_t nSigLen;
  secp256k1_ecdsa_signature sig;
  uchar extra_entropy [32];
  secp256k1_pubkey pk;
  size_t local_e0;
  secp256k1_ecdsa_signature local_d8;
  ulong local_98 [4];
  secp256k1_pubkey local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = (this->keydata)._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (paVar1 == (array<unsigned_char,_32UL> *)0x0) {
LAB_00691116:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return paVar1 != (array<unsigned_char,_32UL> *)0x0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchSig,0x48);
  local_e0 = 0x48;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = (ulong)test_case;
  noncedata = local_98;
  if (grind) {
    noncedata = (ulong *)0x0;
  }
  if (test_case == 0) {
    noncedata = (ulong *)0x0;
  }
  iVar2 = secp256k1_ecdsa_sign
                    (secp256k1_context_sign,&local_d8,(uchar *)hash,
                     ((this->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems,nonce_function_rfc6979,noncedata);
  if (iVar2 != 0) {
    iVar2 = 1;
    do {
      secp256k1_ecdsa_signature_serialize_compact(secp256k1_context_sign,local_78.data,&local_d8);
      if ((-1 < (char)local_78.data[0]) || (!grind)) {
        secp256k1_ecdsa_signature_serialize_der
                  (secp256k1_context_sign,
                   (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start,&local_e0,&local_d8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchSig,local_e0);
        iVar2 = secp256k1_ec_pubkey_create
                          (secp256k1_context_sign,&local_78,
                           ((this->keydata)._M_t.
                            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                           _M_head_impl)->_M_elems);
        if (iVar2 == 0) {
          __assert_fail("ret",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                        ,0xe6,
                        "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                       );
        }
        iVar2 = secp256k1_ecdsa_verify(secp256k1_context_static,&local_d8,(uchar *)hash,&local_78);
        if (iVar2 == 0) {
          __assert_fail("ret",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                        ,0xe8,
                        "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                       );
        }
        goto LAB_00691116;
      }
      local_98[0] = CONCAT44(local_98[0]._4_4_,iVar2);
      iVar3 = secp256k1_ecdsa_sign
                        (secp256k1_context_sign,&local_d8,(uchar *)hash,
                         ((this->keydata)._M_t.
                          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                         _M_head_impl)->_M_elems,nonce_function_rfc6979,local_98);
      iVar2 = iVar2 + 1;
    } while (iVar3 != 0);
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                ,0xe0,
                "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
               );
}

Assistant:

bool CKey::Sign(const uint256 &hash, std::vector<unsigned char>& vchSig, bool grind, uint32_t test_case) const {
    if (!keydata)
        return false;
    vchSig.resize(CPubKey::SIGNATURE_SIZE);
    size_t nSigLen = CPubKey::SIGNATURE_SIZE;
    unsigned char extra_entropy[32] = {0};
    WriteLE32(extra_entropy, test_case);
    secp256k1_ecdsa_signature sig;
    uint32_t counter = 0;
    int ret = secp256k1_ecdsa_sign(secp256k1_context_sign, &sig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, (!grind && test_case) ? extra_entropy : nullptr);

    // Grind for low R
    while (ret && !SigHasLowR(&sig) && grind) {
        WriteLE32(extra_entropy, ++counter);
        ret = secp256k1_ecdsa_sign(secp256k1_context_sign, &sig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, extra_entropy);
    }
    assert(ret);
    secp256k1_ecdsa_signature_serialize_der(secp256k1_context_sign, vchSig.data(), &nSigLen, &sig);
    vchSig.resize(nSigLen);
    // Additional verification step to prevent using a potentially corrupted signature
    secp256k1_pubkey pk;
    ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &pk, UCharCast(begin()));
    assert(ret);
    ret = secp256k1_ecdsa_verify(secp256k1_context_static, &sig, hash.begin(), &pk);
    assert(ret);
    return true;
}